

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounds.h
# Opt level: O0

ostream * libDAI::operator<<(ostream *os,BoundTreeNode *n)

{
  ostream *poVar1;
  undefined8 uVar2;
  ulong *in_RSI;
  ostream *in_RDI;
  string *in_stack_00000010;
  size_t in_stack_00000018;
  Exception *in_stack_00000020;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  ostream *local_8;
  
  if ((int)in_RSI[2] == 0) {
    poVar1 = std::operator<<(in_RDI,"v");
    local_8 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  }
  else {
    if ((int)in_RSI[2] != 1) {
      uVar2 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      Exception::Exception(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
    poVar1 = std::operator<<(in_RDI,"f");
    local_8 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  }
  return local_8;
}

Assistant:

std::ostream& operator << (std::ostream& os, const BoundTreeNode& n) { 
                if( n._type == BoundTreeNode::VAR )
                    return( os << "v" << n._id ); 
                else if( n._type == BoundTreeNode::FACTOR ) 
                    return( os << "f" << n._id ); 
                else
                    DAI_THROW(UNKNOWN_ENUM_VALUE);
            }